

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvscsu.cpp
# Opt level: O0

void useDynamicWindow(SCSUData *scsu,int8_t window)

{
  int local_1c;
  int local_18;
  int j;
  int i;
  int8_t window_local;
  SCSUData *scsu_local;
  
  local_18 = (int)scsu->nextWindowUseIndex;
  do {
    local_18 = local_18 + -1;
    if (local_18 < 0) {
      local_18 = 7;
    }
  } while (scsu->windowUse[local_18] != window);
  local_1c = local_18 + 1;
  if (local_1c == 8) {
    local_1c = 0;
  }
  while (local_1c != scsu->nextWindowUseIndex) {
    scsu->windowUse[local_18] = scsu->windowUse[local_1c];
    local_18 = local_1c;
    local_1c = local_1c + 1;
    if (local_1c == 8) {
      local_1c = 0;
    }
  }
  scsu->windowUse[local_18] = window;
  return;
}

Assistant:

static void
useDynamicWindow(SCSUData *scsu, int8_t window) {
    /*
     * move the existing window, which just became the most recently used one,
     * up in windowUse[] to nextWindowUseIndex-1
     */

    /* first, find the index of the window - backwards to favor the more recently used windows */
    int i, j;

    i=scsu->nextWindowUseIndex;
    do {
        if(--i<0) {
            i=7;
        }
    } while(scsu->windowUse[i]!=window);

    /* now copy each windowUse[i+1] to [i] */
    j=i+1;
    if(j==8) {
        j=0;
    }
    while(j!=scsu->nextWindowUseIndex) {
        scsu->windowUse[i]=scsu->windowUse[j];
        i=j;
        if(++j==8) { j=0; }
    }

    /* finally, set the window into the most recently used index */
    scsu->windowUse[i]=window;
}